

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall CCharacter::FireWeapon(CCharacter *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint Cur;
  long lVar3;
  CGameWorld *pCVar4;
  IServer *pIVar5;
  IConsole *pIVar6;
  CCharacter *this_00;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  CInputCount CVar12;
  undefined4 extraout_var;
  CLaser *this_01;
  CProjectile *pCVar13;
  long lVar14;
  CGameWorld *pCVar15;
  CGameContext *this_02;
  ulong uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  vec2 Force;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar23;
  float fVar24;
  vec2 vVar25;
  undefined1 auVar26 [16];
  vec2 vVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_288;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_284;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  vec2 Direction;
  char aBuf [256];
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar31;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_ReloadTimer != 0) goto LAB_00111049;
  DoWeaponSwitch(this);
  uVar1 = (this->m_LatestInput).m_TargetX;
  uVar2 = (this->m_LatestInput).m_TargetY;
  auVar22._0_4_ = (float)(int)uVar1;
  auVar22._4_4_ = (float)(int)uVar2;
  auVar22._8_8_ = 0;
  auVar28._0_4_ = SQRT(auVar22._0_4_ * auVar22._0_4_ + auVar22._4_4_ * auVar22._4_4_);
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  auVar28 = divps(auVar22,auVar28);
  vVar27 = auVar28._0_8_;
  uVar10 = this->m_ActiveWeapon;
  uVar17 = (ulong)uVar10;
  Cur = (this->m_LatestInput).m_Fire;
  pCVar15 = (CGameWorld *)(ulong)Cur;
  Direction = vVar27;
  CVar12 = CountInput((this->m_LatestPrevInput).m_Fire,Cur);
  if ((Cur & 1) == 0 || uVar10 - 5 < 0xfffffffd) {
    if (CVar12.m_Presses == 0) goto LAB_00111049;
  }
  else if (CVar12.m_Presses == 0 && this->m_aWeapons[uVar17].m_Ammo == 0) goto LAB_00111049;
  if (this->m_aWeapons[(int)uVar10].m_Ammo == 0) {
    pCVar15 = (this->super_CEntity).m_pGameWorld;
    pIVar5 = pCVar15->m_pServer;
    iVar9 = pIVar5->m_TickSpeed;
    this->m_ReloadTimer = iVar9 / 8;
    if (iVar9 + this->m_LastNoAmmoSound <= pIVar5->m_CurrentGameTick) {
      CGameContext::CreateSound(pCVar15->m_pGameServer,(this->super_CEntity).m_Pos,0x1e,-1);
      this->m_LastNoAmmoSound = ((this->super_CEntity).m_pGameWorld)->m_pServer->m_CurrentGameTick;
    }
    goto LAB_00111049;
  }
  uVar8 = (this->super_CEntity).m_ProximityRadius;
  vVar25 = (this->super_CEntity).m_Pos;
  pCVar4 = (this->super_CEntity).m_pGameWorld;
  fVar18 = (this->super_CEntity).m_ProximityRadius;
  if (pCVar4->m_pConfig->m_Debug != 0) {
    uVar10 = this->m_pPlayer->m_ClientID;
    pIVar5 = pCVar4->m_pServer;
    iVar9 = (*(pIVar5->super_IInterface)._vptr_IInterface[2])(pIVar5,(ulong)uVar10);
    str_format(aBuf,0x100,"shot player=\'%d:%s\' team=%d weapon=%d",(ulong)uVar10,
               CONCAT44(extraout_var,iVar9),(ulong)(uint)this->m_pPlayer->m_Team,
               (ulong)(uint)this->m_ActiveWeapon);
    pIVar6 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_pConsole;
    pCVar15 = (CGameWorld *)0x2;
    (*(pIVar6->super_IInterface)._vptr_IInterface[0x19])(pIVar6,2,"game",aBuf,0);
    uVar17 = (ulong)(uint)this->m_ActiveWeapon;
    fVar18 = (float)uVar8;
  }
  if ((uint)uVar17 < 6) {
    local_278 = auVar28._0_4_;
    fStack_274 = auVar28._4_4_;
    fStack_270 = auVar28._8_4_;
    fStack_26c = auVar28._12_4_;
    local_288.x = vVar25.field_0.x + fVar18 * local_278 * 0.75;
    aStack_284.y = vVar25.field_1.y + fVar18 * fStack_274 * 0.75;
    switch(uVar17) {
    case 0:
      CGameContext::CreateSound
                (((this->super_CEntity).m_pGameWorld)->m_pGameServer,(this->super_CEntity).m_Pos,3,
                 -1);
      uVar10 = CGameWorld::FindEntities
                         ((this->super_CEntity).m_pGameWorld,_local_288,
                          (this->super_CEntity).m_ProximityRadius * 0.5,(CEntity **)aBuf,0x40,3);
      uVar16 = 0;
      uVar17 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar17 = uVar16;
      }
      iVar9 = 0;
      for (; uVar17 != uVar16; uVar16 = uVar16 + 1) {
        this_00 = *(CCharacter **)(aBuf + uVar16 * 8);
        if ((this_00 != this) &&
           (iVar11 = CCollision::IntersectLine
                               (&((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_Collision,
                                _local_288,(this_00->super_CEntity).m_Pos,(vec2 *)0x0,(vec2 *)0x0),
           iVar11 == 0)) {
          vVar27 = (this_00->super_CEntity).m_Pos;
          aVar23 = vVar27.field_0;
          auVar29._0_4_ = aVar23.x - local_288.x;
          aVar31 = vVar27.field_1;
          auVar29._4_4_ = aVar31.y - aStack_284.y;
          auVar29._8_4_ = 0.0 - (fVar18 * fStack_270 * 0.0 + 0.0);
          auVar29._12_4_ = 0.0 - (fVar18 * fStack_26c * 0.0 + 0.0);
          fVar19 = SQRT(auVar29._0_4_ * auVar29._0_4_ + auVar29._4_4_ * auVar29._4_4_);
          vVar25 = _local_288;
          if (0.0 < fVar19) {
            auVar7._4_4_ = fVar19;
            auVar7._0_4_ = fVar19;
            auVar7._8_4_ = fVar19;
            auVar7._12_4_ = fVar19;
            auVar28 = divps(auVar29,auVar7);
            fVar19 = (this->super_CEntity).m_ProximityRadius;
            vVar25.field_0.x = aVar23.x + fVar19 * auVar28._0_4_ * -0.5;
            vVar25.field_1.y = aVar31.y + fVar19 * auVar28._4_4_ * -0.5;
          }
          CGameContext::CreateHammerHit(((this->super_CEntity).m_pGameWorld)->m_pGameServer,vVar25);
          vVar27 = (this_00->super_CEntity).m_Pos;
          vVar25 = (this->super_CEntity).m_Pos;
          auVar26._0_4_ = vVar27.field_0.x - vVar25.field_0.x;
          auVar26._4_4_ = vVar27.field_1.y - vVar25.field_1.y;
          auVar26._8_8_ = 0;
          auVar20._0_4_ = SQRT(auVar26._0_4_ * auVar26._0_4_ + auVar26._4_4_ * auVar26._4_4_);
          if (0.0 < auVar20._0_4_) {
            auVar20._4_4_ = auVar20._0_4_;
            auVar20._8_4_ = auVar20._0_4_;
            auVar20._12_4_ = auVar20._0_4_;
            auVar28 = divps(auVar26,auVar20);
          }
          else {
            auVar28 = ZEXT816(0xbf80000000000000);
          }
          auVar21._0_4_ = auVar28._0_4_ + 0.0;
          auVar21._4_4_ = auVar28._4_4_ + -1.1;
          auVar21._8_4_ = auVar28._8_4_ + 0.0;
          auVar21._12_4_ = auVar28._12_4_ + 0.0;
          auVar30._0_4_ = SQRT(auVar21._0_4_ * auVar21._0_4_ + auVar21._4_4_ * auVar21._4_4_);
          auVar30._4_4_ = auVar30._0_4_;
          auVar30._8_4_ = auVar30._0_4_;
          auVar30._12_4_ = auVar30._0_4_;
          auVar22 = divps(auVar21,auVar30);
          Force.field_0.x = auVar22._0_4_ * 10.0 + 0.0;
          Force.field_1.y = auVar22._4_4_ * 10.0 + -1.0;
          TakeDamage(this_00,Force,(vec2)(auVar28._0_8_ ^ 0x8000000080000000),
                     ((g_pData->m_Weapons).m_Hammer.m_pBase)->m_Damage,this->m_pPlayer->m_ClientID,
                     this->m_ActiveWeapon);
          iVar9 = iVar9 + 1;
        }
      }
      if (iVar9 != 0) {
        this->m_ReloadTimer = ((this->super_CEntity).m_pGameWorld)->m_pServer->m_TickSpeed / 3;
      }
      goto LAB_00111742;
    case 1:
      pCVar13 = (CProjectile *)CEntity::operator_new((CEntity *)0x68,(size_t)pCVar15);
      pCVar15 = (this->super_CEntity).m_pGameWorld;
      CProjectile::CProjectile
                (pCVar13,pCVar15,1,this->m_pPlayer->m_ClientID,_local_288,vVar27,
                 (int)(((float)(pCVar15->m_pGameServer->m_Tuning).m_GunLifetime.m_Value / 100.0) *
                      (float)pCVar15->m_pServer->m_TickSpeed),
                 ((g_pData->m_Weapons).m_Gun.m_pBase)->m_Damage,false,0.0,-1,1);
      this_02 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar27 = (this->super_CEntity).m_Pos;
      iVar9 = 0;
      break;
    case 2:
      iVar9 = -2;
      for (lVar14 = 0; lVar14 != 0x14; lVar14 = lVar14 + 4) {
        fVar18 = angle(&Direction);
        fVar18 = fVar18 + *(float *)((long)&DAT_00141d60 + lVar14);
        iVar11 = -iVar9;
        if (0 < iVar9) {
          iVar11 = iVar9;
        }
        fVar24 = (float)(((this->super_CEntity).m_pGameWorld)->m_pGameServer->m_Tuning).
                        m_ShotgunSpeeddiff.m_Value / 100.0;
        fVar24 = (1.0 - fVar24) * ((float)iVar11 * -0.5 + 1.0) + fVar24;
        pCVar13 = (CProjectile *)CEntity::operator_new((CEntity *)0x68,(size_t)pCVar15);
        pCVar15 = (this->super_CEntity).m_pGameWorld;
        iVar11 = this->m_pPlayer->m_ClientID;
        fVar19 = cosf(fVar18);
        fVar18 = sinf(fVar18);
        pCVar4 = (this->super_CEntity).m_pGameWorld;
        vVar27.field_0.x = fVar19 * fVar24;
        vVar27.field_1.y = fVar18 * fVar24;
        CProjectile::CProjectile
                  (pCVar13,pCVar15,2,iVar11,_local_288,vVar27,
                   (int)(((float)(pCVar4->m_pGameServer->m_Tuning).m_ShotgunLifetime.m_Value / 100.0
                         ) * (float)pCVar4->m_pServer->m_TickSpeed),
                   ((g_pData->m_Weapons).m_Shotgun.m_pBase)->m_Damage,false,0.0,-1,2);
        iVar9 = iVar9 + 1;
      }
      this_02 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar27 = (this->super_CEntity).m_Pos;
      iVar9 = 1;
      break;
    case 3:
      pCVar13 = (CProjectile *)CEntity::operator_new((CEntity *)0x68,(size_t)pCVar15);
      pCVar15 = (this->super_CEntity).m_pGameWorld;
      CProjectile::CProjectile
                (pCVar13,pCVar15,3,this->m_pPlayer->m_ClientID,_local_288,vVar27,
                 (int)(((float)(pCVar15->m_pGameServer->m_Tuning).m_GrenadeLifetime.m_Value / 100.0)
                      * (float)pCVar15->m_pServer->m_TickSpeed),
                 ((g_pData->m_Weapons).m_Grenade.m_pBase)->m_Damage,true,0.0,6,3);
      this_02 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar27 = (this->super_CEntity).m_Pos;
      iVar9 = 2;
      break;
    case 4:
      this_01 = (CLaser *)CEntity::operator_new((CEntity *)0x58,(size_t)pCVar15);
      pCVar15 = (this->super_CEntity).m_pGameWorld;
      CLaser::CLaser(this_01,pCVar15,(this->super_CEntity).m_Pos,vVar27,
                     (float)(pCVar15->m_pGameServer->m_Tuning).m_LaserReach.m_Value / 100.0,
                     this->m_pPlayer->m_ClientID);
      this_02 = ((this->super_CEntity).m_pGameWorld)->m_pGameServer;
      vVar27 = (this->super_CEntity).m_Pos;
      iVar9 = 8;
      break;
    case 5:
      this->m_NumObjectsHit = 0;
      (this->m_Ninja).m_ActivationDir.field_0.x = local_278;
      (this->m_Ninja).m_ActivationDir.field_1.y = fStack_274;
      pCVar15 = (this->super_CEntity).m_pGameWorld;
      (this->m_Ninja).m_CurrentMoveTime =
           (pCVar15->m_pServer->m_TickSpeed * (g_pData->m_Weapons).m_Ninja.m_Movetime) / 1000;
      fVar18 = (this->m_Core).m_Vel.field_0.x;
      fVar19 = (this->m_Core).m_Vel.field_1.y;
      (this->m_Ninja).m_OldVelAmount = (int)SQRT(fVar18 * fVar18 + fVar19 * fVar19);
      this_02 = pCVar15->m_pGameServer;
      vVar27 = (this->super_CEntity).m_Pos;
      iVar9 = 5;
    }
    CGameContext::CreateSound(this_02,vVar27,iVar9,-1);
  }
LAB_00111742:
  pIVar5 = ((this->super_CEntity).m_pGameWorld)->m_pServer;
  this->m_AttackTick = pIVar5->m_CurrentGameTick;
  iVar9 = this->m_ActiveWeapon;
  iVar11 = this->m_aWeapons[iVar9].m_Ammo;
  if (0 < iVar11) {
    this->m_aWeapons[iVar9].m_Ammo = iVar11 + -1;
  }
  if (this->m_ReloadTimer == 0) {
    this->m_ReloadTimer =
         (pIVar5->m_TickSpeed * (g_pData->m_Weapons).m_aId[iVar9].m_Firedelay) / 1000;
  }
LAB_00111049:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCharacter::FireWeapon()
{
	if(m_ReloadTimer != 0)
		return;

	DoWeaponSwitch();
	vec2 Direction = normalize(vec2(m_LatestInput.m_TargetX, m_LatestInput.m_TargetY));

	bool FullAuto = false;
	if(m_ActiveWeapon == WEAPON_GRENADE || m_ActiveWeapon == WEAPON_SHOTGUN || m_ActiveWeapon == WEAPON_LASER)
		FullAuto = true;


	// check if we gonna fire
	bool WillFire = false;
	if(CountInput(m_LatestPrevInput.m_Fire, m_LatestInput.m_Fire).m_Presses)
		WillFire = true;

	if(FullAuto && (m_LatestInput.m_Fire&1) && m_aWeapons[m_ActiveWeapon].m_Ammo)
		WillFire = true;

	if(!WillFire)
		return;

	// check for ammo
	if(!m_aWeapons[m_ActiveWeapon].m_Ammo)
	{
		// 125ms is a magical limit of how fast a human can click
		m_ReloadTimer = 125 * Server()->TickSpeed() / 1000;
		if(m_LastNoAmmoSound+Server()->TickSpeed() <= Server()->Tick())
		{
			GameServer()->CreateSound(m_Pos, SOUND_WEAPON_NOAMMO);
			m_LastNoAmmoSound = Server()->Tick();
		}
		return;
	}

	vec2 ProjStartPos = m_Pos+Direction*GetProximityRadius()*0.75f;

	if(Config()->m_Debug)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "shot player='%d:%s' team=%d weapon=%d", m_pPlayer->GetCID(), Server()->ClientName(m_pPlayer->GetCID()), m_pPlayer->GetTeam(), m_ActiveWeapon);
		GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
	}

	switch(m_ActiveWeapon)
	{
		case WEAPON_HAMMER:
		{
			GameServer()->CreateSound(m_Pos, SOUND_HAMMER_FIRE);

			CCharacter *apEnts[MAX_CLIENTS];
			int Hits = 0;
			int Num = GameWorld()->FindEntities(ProjStartPos, GetProximityRadius()*0.5f, (CEntity**)apEnts,
														MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);

			for(int i = 0; i < Num; ++i)
			{
				CCharacter *pTarget = apEnts[i];

				if((pTarget == this) || GameServer()->Collision()->IntersectLine(ProjStartPos, pTarget->m_Pos, NULL, NULL))
					continue;

				// set his velocity to fast upward (for now)
				if(length(pTarget->m_Pos-ProjStartPos) > 0.0f)
					GameServer()->CreateHammerHit(pTarget->m_Pos-normalize(pTarget->m_Pos-ProjStartPos)*GetProximityRadius()*0.5f);
				else
					GameServer()->CreateHammerHit(ProjStartPos);

				vec2 Dir;
				if(length(pTarget->m_Pos - m_Pos) > 0.0f)
					Dir = normalize(pTarget->m_Pos - m_Pos);
				else
					Dir = vec2(0.f, -1.f);

				pTarget->TakeDamage(vec2(0.f, -1.f) + normalize(Dir + vec2(0.f, -1.1f)) * 10.0f, Dir*-1, g_pData->m_Weapons.m_Hammer.m_pBase->m_Damage,
					m_pPlayer->GetCID(), m_ActiveWeapon);
				Hits++;
			}

			// if we Hit anything, we have to wait for the reload
			if(Hits)
				m_ReloadTimer = Server()->TickSpeed()/3;

		} break;

		case WEAPON_GUN:
		{
			new CProjectile(GameWorld(), WEAPON_GUN,
				m_pPlayer->GetCID(),
				ProjStartPos,
				Direction,
				(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_GunLifetime),
				g_pData->m_Weapons.m_Gun.m_pBase->m_Damage, false, 0, -1, WEAPON_GUN);

			GameServer()->CreateSound(m_Pos, SOUND_GUN_FIRE);
		} break;

		case WEAPON_SHOTGUN:
		{
			int ShotSpread = 2;

			for(int i = -ShotSpread; i <= ShotSpread; ++i)
			{
				float Spreading[] = {-0.185f, -0.070f, 0, 0.070f, 0.185f};
				float a = angle(Direction);
				a += Spreading[i+2];
				float v = 1-(absolute(i)/(float)ShotSpread);
				float Speed = mix((float)GameServer()->Tuning()->m_ShotgunSpeeddiff, 1.0f, v);
				new CProjectile(GameWorld(), WEAPON_SHOTGUN,
					m_pPlayer->GetCID(),
					ProjStartPos,
					vec2(cosf(a), sinf(a))*Speed,
					(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_ShotgunLifetime),
					g_pData->m_Weapons.m_Shotgun.m_pBase->m_Damage, false, 0, -1, WEAPON_SHOTGUN);
			}

			GameServer()->CreateSound(m_Pos, SOUND_SHOTGUN_FIRE);
		} break;

		case WEAPON_GRENADE:
		{
			new CProjectile(GameWorld(), WEAPON_GRENADE,
				m_pPlayer->GetCID(),
				ProjStartPos,
				Direction,
				(int)(Server()->TickSpeed()*GameServer()->Tuning()->m_GrenadeLifetime),
				g_pData->m_Weapons.m_Grenade.m_pBase->m_Damage, true, 0, SOUND_GRENADE_EXPLODE, WEAPON_GRENADE);

			GameServer()->CreateSound(m_Pos, SOUND_GRENADE_FIRE);
		} break;

		case WEAPON_LASER:
		{
			new CLaser(GameWorld(), m_Pos, Direction, GameServer()->Tuning()->m_LaserReach, m_pPlayer->GetCID());
			GameServer()->CreateSound(m_Pos, SOUND_LASER_FIRE);
		} break;

		case WEAPON_NINJA:
		{
			m_NumObjectsHit = 0;

			m_Ninja.m_ActivationDir = Direction;
			m_Ninja.m_CurrentMoveTime = g_pData->m_Weapons.m_Ninja.m_Movetime * Server()->TickSpeed() / 1000;
			m_Ninja.m_OldVelAmount = length(m_Core.m_Vel);

			GameServer()->CreateSound(m_Pos, SOUND_NINJA_FIRE);
		} break;

	}

	m_AttackTick = Server()->Tick();

	if(m_aWeapons[m_ActiveWeapon].m_Ammo > 0) // -1 == unlimited
		m_aWeapons[m_ActiveWeapon].m_Ammo--;

	if(!m_ReloadTimer)
		m_ReloadTimer = g_pData->m_Weapons.m_aId[m_ActiveWeapon].m_Firedelay * Server()->TickSpeed() / 1000;
}